

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_insn.c
# Opt level: O1

int pt_insn_is_ptwrite(pt_insn *insn,pt_insn_ext *iext)

{
  uint uVar1;
  
  uVar1 = 0;
  if (insn != (pt_insn *)0x0) {
    uVar1 = (uint)(insn->iclass == ptic_ptwrite);
  }
  return uVar1;
}

Assistant:

int pt_insn_is_ptwrite(const struct pt_insn *insn,
		       const struct pt_insn_ext *iext)
{
	(void) iext;

	if (!insn)
		return 0;

	switch (insn->iclass) {
	default:
		return 0;

	case ptic_ptwrite:
		return 1;
	}
}